

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::makeStructCmpxchg<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *__rhs;
  Result<unsigned_int> *pRVar1;
  __index_type *p_Var2;
  HeapTypeT type_00;
  undefined1 local_138 [8];
  Result<wasm::MemoryOrder> order1;
  string local_f0 [32];
  undefined1 local_d0 [8];
  Result<unsigned_int> _val_3;
  Result<wasm::MemoryOrder> order2;
  Result<unsigned_int> field;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> type;
  
  memorder<wasm::WATParser::ParseDefsCtx>((Result<wasm::MemoryOrder> *)local_138,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)
             ((long)&_val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
             (_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)local_138);
  if (order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
      super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
      super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
      super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
      super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
      super__Variant_storage_alias<wasm::MemoryOrder,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string
              ((string *)
               ((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
               (string *)
               ((long)&_val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    pRVar1 = &field;
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)
                      ((long)&_val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
                              super__Move_assign_alias<unsigned_int,_wasm::Err>.
                              super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                              super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                              super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    memorder<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::MemoryOrder> *)
               ((long)&_val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)
               ((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
               (_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)
               ((long)&_val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    if (type.val.
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        ._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),
                 (string *)
                 ((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)
                        ((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
      goto LAB_00c782d6;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)
                      ((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                              super__Move_assign_alias<unsigned_int,_wasm::Err>.
                              super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                              super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                              super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    if (local_138._0_4_ ==
        _val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_4_) {
      typeidx<wasm::WATParser::ParseDefsCtx>
                ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *
                 )((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                          super__Move_assign_alias<unsigned_int,_wasm::Err>.
                          super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                          super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                          super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),ctx);
      __rhs = (__index_type *)
              ((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                      super__Move_assign_alias<unsigned_int,_wasm::Err>.
                      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                      super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20);
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         *)((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                   super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),
                        (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         *)__rhs);
      if (field.val.super__Variant_base<unsigned_int,_wasm::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)local_d0,
                   (string *)
                   ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_d0);
        std::__cxx11::string::~string((string *)local_d0);
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                             *)((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20))
        ;
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                             *)((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20))
        ;
        p_Var2 = (__index_type *)0x0;
        if (type.val.
            super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
            .
            super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
            ._M_u._24_1_ == '\0') {
          p_Var2 = __rhs;
        }
        type_00.exactness = *(undefined4 *)(p_Var2 + 8);
        type_00.type.id =
             field.val.super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_;
        type_00._12_4_ = 0;
        fieldidx<wasm::WATParser::ParseDefsCtx>
                  ((Result<unsigned_int> *)
                   ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),ctx,type_00)
        ;
        std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_d0,
                   (_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)
                   ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
        if (_val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
            super__Move_assign_alias<unsigned_int,_wasm::Err>.
            super__Copy_assign_alias<unsigned_int,_wasm::Err>.
            super__Move_ctor_alias<unsigned_int,_wasm::Err>.
            super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
            super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_ == '\x01') {
          std::__cxx11::string::string(local_f0,(string *)local_d0);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
          _Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_f0);
          std::__cxx11::string::~string(local_f0);
          std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_d0);
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_d0);
          ParseDefsCtx::makeStructCmpxchg
                    (__return_storage_ptr__,ctx,pos,annotations,
                     (HeapType)
                     field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_,
                     order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                     super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Variant_storage_alias<wasm::MemoryOrder,_wasm::Err>._32_4_,
                     local_138._0_4_);
        }
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
                          ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      }
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           *)((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                     super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
      goto LAB_00c782d6;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               ((long)&order1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),
               "struct.atomic.rmw memory orders must be identical",
               (allocator<char> *)
               ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
    Lexer::err((Err *)((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                              super__Move_assign_alias<unsigned_int,_wasm::Err>.
                              super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                              super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                              super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),&ctx->in,
               (ulong)pos,
               (string *)
               ((long)&order1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    pRVar1 = (Result<unsigned_int> *)&order1;
  }
  std::__cxx11::string::~string
            ((string *)
             ((long)&(pRVar1->val).super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
LAB_00c782d6:
  std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)
             ((long)&_val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
  std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)local_138);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeStructCmpxchg(Ctx& ctx,
                           Index pos,
                           const std::vector<Annotation>& annotations) {
  auto order1 = memorder(ctx);
  CHECK_ERR(order1);
  auto order2 = memorder(ctx);
  CHECK_ERR(order2);
  if (*order1 != *order2) {
    return ctx.in.err(pos, "struct.atomic.rmw memory orders must be identical");
  }
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  auto field = fieldidx(ctx, *type);
  CHECK_ERR(field);
  return ctx.makeStructCmpxchg(pos, annotations, *type, *field, *order1);
}